

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O3

Aig_Man_t * Iso_ManFilterPos_old(Aig_Man_t *pAig,int fVerbose)

{
  void *__ptr;
  void *__ptr_00;
  uint *puVar1;
  void *pvVar2;
  uint *__ptr_01;
  Aig_Man_t *pAVar3;
  undefined8 *puVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint local_74;
  undefined8 *local_70;
  Vec_Int_t *local_68;
  uint local_5c;
  uint *local_58;
  Aig_Man_t *local_50;
  ulong local_48;
  Aig_Man_t *local_40;
  ulong local_38;
  
  uVar8 = pAig->nObjs[3] - pAig->nRegs;
  local_40 = pAig;
  local_58 = (uint *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar8 - 1) {
    uVar13 = (ulong)uVar8;
  }
  local_58[1] = 0;
  uVar12 = (uint)uVar13;
  *local_58 = uVar12;
  local_68 = (Vec_Int_t *)(ulong)uVar8;
  if (uVar12 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = malloc((long)(int)uVar12 * 8);
  }
  *(void **)(local_58 + 2) = pvVar2;
  __ptr_01 = (uint *)malloc(0x10);
  lVar10 = 0;
  __ptr_01[1] = 0;
  *__ptr_01 = uVar12;
  if (uVar12 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = malloc((long)(int)uVar12 << 3);
  }
  *(void **)(__ptr_01 + 2) = pvVar2;
  local_74 = 0;
  if (0 < (int)local_68) {
    lVar11 = 0;
    uVar14 = uVar13;
    do {
      pAVar3 = Saig_ManDupCones(local_40,(int *)&local_74,1);
      local_50 = (Aig_Man_t *)Saig_ManFindIsoPerm(pAVar3,0);
      puVar1 = local_58;
      iVar15 = (int)lVar11;
      iVar9 = (int)uVar13;
      if (iVar15 == iVar9) {
        if (iVar9 < 0x10) {
          if (*(void **)(local_58 + 2) == (void *)0x0) {
            pvVar2 = malloc(0x80);
          }
          else {
            pvVar2 = realloc(*(void **)(local_58 + 2),0x80);
          }
          *(void **)(puVar1 + 2) = pvVar2;
          *puVar1 = 0x10;
          uVar13 = 0x10;
        }
        else {
          uVar13 = (ulong)(uint)(iVar9 * 2);
          if (*(void **)(local_58 + 2) == (void *)0x0) {
            pvVar2 = malloc(uVar13 * 8);
          }
          else {
            pvVar2 = realloc(*(void **)(local_58 + 2),uVar13 * 8);
          }
          *(void **)(puVar1 + 2) = pvVar2;
          *puVar1 = iVar9 * 2;
        }
      }
      else {
        pvVar2 = *(void **)(local_58 + 2);
      }
      puVar1[1] = iVar15 + 1;
      *(Aig_Man_t **)((long)pvVar2 + lVar11 * 8) = pAVar3;
      iVar9 = (int)uVar14;
      if (iVar15 == iVar9) {
        if (iVar9 < 0x10) {
          if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
            pvVar2 = malloc(0x80);
          }
          else {
            pvVar2 = realloc(*(void **)(__ptr_01 + 2),0x80);
          }
          *(void **)(__ptr_01 + 2) = pvVar2;
          *__ptr_01 = 0x10;
          uVar14 = 0x10;
        }
        else {
          uVar14 = (ulong)(uint)(iVar9 * 2);
          if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
            pvVar2 = malloc(uVar14 * 8);
          }
          else {
            pvVar2 = realloc(*(void **)(__ptr_01 + 2),uVar14 * 8);
          }
          *(void **)(__ptr_01 + 2) = pvVar2;
          *__ptr_01 = iVar9 * 2;
        }
      }
      else {
        pvVar2 = *(void **)(__ptr_01 + 2);
      }
      lVar10 = lVar11 + 1;
      __ptr_01[1] = (uint)lVar10;
      *(Aig_Man_t **)((long)pvVar2 + lVar11 * 8) = local_50;
      local_74 = local_74 + 1;
      lVar11 = lVar10;
    } while ((int)local_74 < (int)local_68);
  }
  puVar4 = (undefined8 *)malloc(0x10);
  *puVar4 = 1000;
  pvVar2 = malloc(8000);
  puVar4[1] = pvVar2;
  local_70 = puVar4;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  local_74 = 0;
  uVar8 = (uint)lVar10;
  local_68 = pVVar5;
  if ((int)uVar8 < 1) {
    pvVar2 = *(void **)(local_58 + 2);
LAB_0062cab8:
    local_74 = 0;
    if (pvVar2 != (void *)0x0) goto LAB_0062cabd;
  }
  else {
    local_48 = 1000;
    uVar13 = 0;
    do {
      uVar12 = (uint)uVar13;
      if ((int)local_74 < 0) goto LAB_0062cb8e;
      local_50 = *(Aig_Man_t **)(*(long *)(local_58 + 2) + (ulong)local_74 * 8);
      local_5c = uVar12;
      local_38 = uVar13;
      if ((int)uVar12 < 1) {
        uVar13 = 0;
LAB_0062c98d:
        uVar12 = local_5c;
        if ((uint)uVar13 == local_5c) goto LAB_0062c992;
      }
      else {
        lVar10 = local_70[1];
        uVar12 = local_68->nSize;
        if (local_68->nSize < 1) {
          uVar12 = 0;
        }
        uVar13 = 0;
        do {
          if (uVar12 == uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar9 = local_68->pArray[uVar13];
          if (((((long)iVar9 < 0) || ((int)uVar8 <= iVar9)) || ((long)(int)local_74 < 0)) ||
             (uVar8 <= local_74)) goto LAB_0062cb8e;
          pVVar5 = Iso_ManFindMapping(*(Aig_Man_t **)(lVar10 + uVar13 * 8),local_50,
                                      *(Vec_Int_t **)(*(long *)(__ptr_01 + 2) + (long)iVar9 * 8),
                                      *(Vec_Int_t **)
                                       (*(long *)(__ptr_01 + 2) + (long)(int)local_74 * 8),0);
          if (pVVar5 != (Vec_Int_t *)0x0) {
            if (pVVar5->pArray != (int *)0x0) {
              free(pVVar5->pArray);
            }
            free(pVVar5);
            goto LAB_0062c98d;
          }
          uVar13 = uVar13 + 1;
        } while (local_38 != uVar13);
LAB_0062c992:
        uVar12 = local_5c;
        uVar7 = (uint)local_48;
        if (local_5c == uVar7) {
          if (uVar7 < 0x10) {
            if ((void *)local_70[1] == (void *)0x0) {
              pvVar2 = malloc(0x80);
            }
            else {
              pvVar2 = realloc((void *)local_70[1],0x80);
            }
            local_70[1] = pvVar2;
            *(undefined4 *)local_70 = 0x10;
            local_48 = 0x10;
          }
          else {
            local_48 = (ulong)(uVar7 * 2);
            if ((void *)local_70[1] == (void *)0x0) {
              pvVar2 = malloc(local_48 * 8);
            }
            else {
              pvVar2 = realloc((void *)local_70[1],local_48 * 8);
            }
            local_70[1] = pvVar2;
            *(int *)local_70 = (int)local_48;
          }
        }
        else {
          pvVar2 = (void *)local_70[1];
        }
        *(Aig_Man_t **)((long)pvVar2 + local_38 * 8) = local_50;
        Vec_IntPush(local_68,local_74);
        uVar12 = uVar12 + 1;
      }
      uVar13 = (ulong)uVar12;
      local_74 = local_74 + 1;
    } while ((int)local_74 < (int)uVar8);
    *(uint *)((long)local_70 + 4) = uVar12;
    local_74 = 0;
    pvVar2 = *(void **)(local_58 + 2);
    if ((int)uVar8 < 1) goto LAB_0062cab8;
    do {
      if ((int)local_74 < 0) goto LAB_0062cb8e;
      Aig_ManStop(*(Aig_Man_t **)((long)pvVar2 + (ulong)local_74 * 8));
      local_74 = local_74 + 1;
    } while ((int)local_74 < (int)uVar8);
LAB_0062cabd:
    free(pvVar2);
  }
  free(local_58);
  local_74 = 0;
  pvVar2 = *(void **)(__ptr_01 + 2);
  if ((int)uVar8 < 1) {
    if (pvVar2 == (void *)0x0) goto LAB_0062cb24;
  }
  else {
    do {
      if ((int)local_74 < 0) {
LAB_0062cb8e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      __ptr = *(void **)((long)pvVar2 + (ulong)local_74 * 8);
      __ptr_00 = *(void **)((long)__ptr + 8);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      free(__ptr);
      local_74 = local_74 + 1;
    } while ((int)local_74 < (int)uVar8);
  }
  free(pvVar2);
LAB_0062cb24:
  free(__ptr_01);
  piVar6 = local_68->pArray;
  pAVar3 = Saig_ManDupCones(local_40,piVar6,local_68->nSize);
  if ((void *)local_70[1] != (void *)0x0) {
    free((void *)local_70[1]);
  }
  free(local_70);
  if (piVar6 != (int *)0x0) {
    free(piVar6);
  }
  free(local_68);
  return pAVar3;
}

Assistant:

Aig_Man_t * Iso_ManFilterPos_old( Aig_Man_t * pAig, int fVerbose )
{
    int fVeryVerbose = 0;
    Vec_Ptr_t * vParts, * vPerms, * vAigs;
    Vec_Int_t * vPos, * vMap;
    Aig_Man_t * pPart, * pTemp;
    int i, k, nPos;

    // derive AIG for each PO
    nPos = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
    vParts = Vec_PtrAlloc( nPos );
    vPerms = Vec_PtrAlloc( nPos );
    for ( i = 0; i < nPos; i++ )
    {
        pPart = Saig_ManDupCones( pAig, &i, 1 );
        vMap  = Saig_ManFindIsoPerm( pPart, fVeryVerbose );
        Vec_PtrPush( vParts, pPart ); 
        Vec_PtrPush( vPerms, vMap );
    }
//    s_Counter = 0;

    // check AIGs for each PO
    vAigs = Vec_PtrAlloc( 1000 );
    vPos  = Vec_IntAlloc( 1000 );
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pPart, i )
    {
        if ( fVeryVerbose )
        {
            printf( "AIG %4d : ", i );
            Aig_ManPrintStats( pPart );
        }
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, k )
        {
            if ( fVeryVerbose )
                printf( "Comparing AIG %4d and AIG %4d.  ", Vec_IntEntry(vPos,k), i );
            vMap = Iso_ManFindMapping( pTemp, pPart, 
                (Vec_Int_t *)Vec_PtrEntry(vPerms, Vec_IntEntry(vPos,k)), 
                (Vec_Int_t *)Vec_PtrEntry(vPerms, i),
                fVeryVerbose );
            if ( vMap != NULL )
            {
                if ( fVeryVerbose )
                    printf( "Found match\n" );
//                if ( fVerbose )
//                    printf( "Found match for AIG %4d and AIG %4d.\n", Vec_IntEntry(vPos,k), i );
                Vec_IntFree( vMap );
                break;
            }
            if ( fVeryVerbose )
                printf( "No match.\n" );
        }
        if ( k == Vec_PtrSize(vAigs) )
        {
            Vec_PtrPush( vAigs, pPart );
            Vec_IntPush( vPos, i );
        }
    }
    // delete AIGs
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pPart, i )
        Aig_ManStop( pPart );
    Vec_PtrFree( vParts );
    Vec_PtrForEachEntry( Vec_Int_t *, vPerms, vMap, i )
        Vec_IntFree( vMap );
    Vec_PtrFree( vPerms );
    // derive the resulting AIG
    pPart = Saig_ManDupCones( pAig, Vec_IntArray(vPos), Vec_IntSize(vPos) );
    Vec_PtrFree( vAigs );
    Vec_IntFree( vPos );

//    printf( "The number of all checks %d.  Complex checks %d.\n", nPos*(nPos-1)/2, s_Counter );
    return pPart;
}